

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<int>::growAppend(QCommonArrayOps<int> *this,int *b,int *e)

{
  bool bVar1;
  QArrayDataPointer<int> *this_00;
  QCommonArrayOps<int> *in_RDX;
  QCommonArrayOps<int> *in_RSI;
  int **in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QArrayDataPointer<int> *in_stack_ffffffffffffffa0;
  QPodArrayOps<int> *in_stack_ffffffffffffffb0;
  GrowthPosition in_stack_ffffffffffffffbc;
  int **p;
  QArrayDataPointer<int> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    this_00 = (QArrayDataPointer<int> *)((long)in_RDX - (long)in_RSI >> 2);
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    p = in_RDI;
    QArrayDataPointer<int>::QArrayDataPointer(&local_28);
    bVar1 = q_points_into_range<QtPrivate::QCommonArrayOps<int>,int_const*>(p,in_RDX);
    if (bVar1) {
      QArrayDataPointer<int>::detachAndGrow
                (this_00,in_stack_ffffffffffffffbc,(qsizetype)in_stack_ffffffffffffffb0,in_RDI,
                 in_stack_ffffffffffffffa0);
    }
    else {
      QArrayDataPointer<int>::detachAndGrow
                (this_00,in_stack_ffffffffffffffbc,(qsizetype)in_stack_ffffffffffffffb0,in_RDI,
                 in_stack_ffffffffffffffa0);
    }
    QPodArrayOps<int>::copyAppend
              (in_stack_ffffffffffffffb0,(int *)in_RDI,(int *)in_stack_ffffffffffffffa0);
    QArrayDataPointer<int>::~QArrayDataPointer(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }